

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O0

void ur_df2(double *y,int N,char *type,int *lags,char *selectlags,double *cval,int *cvrows,
           int *cvcols,double *cprobs,double *teststat,int *ltstat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *oup;
  double *y_00;
  void *__src;
  double *res_00;
  void *__ptr;
  double *pdVar9;
  double *pdVar10;
  reg_object prVar11;
  long lVar12;
  double dVar13;
  int local_49c;
  double local_498;
  double cval_phi3 [18];
  double cval_phi2 [18];
  double cval_phi1 [18];
  double cval_tau3 [18];
  double cval_tau2 [18];
  double cval_tau1 [18];
  double phi3;
  double phi2;
  double phi1;
  double dfs;
  double sos;
  double scale;
  double tau;
  double ctemp;
  double alpha;
  reg_object phi3_fit;
  reg_object phi2_fit;
  reg_object phi1_fit;
  reg_object fit;
  double *XX3;
  double *XX2;
  double *res;
  double *varcovar;
  double *XX;
  double *z_diff_lag;
  double *critRes;
  double *tt;
  double *z_lag_1;
  double *z_diff;
  double *x;
  double *z;
  int row1;
  int rowselec;
  int p3;
  int p2;
  int p1;
  int ltmp;
  int p;
  int iter;
  int j;
  int i;
  int N2;
  int N1;
  int lag;
  int lags_;
  double *cval_local;
  char *selectlags_local;
  int *lags_local;
  char *type_local;
  int N_local;
  double *y_local;
  
  memcpy(cval_tau2 + 0x11,&DAT_0017afc0,0x90);
  memcpy(cval_tau3 + 0x11,&DAT_0017b050,0x90);
  memcpy(cval_phi1 + 0x11,&DAT_0017b0e0,0x90);
  memcpy(cval_phi2 + 0x11,&DAT_0017b170,0x90);
  memcpy(cval_phi3 + 0x11,&DAT_0017b200,0x90);
  memcpy(&local_498,&DAT_0017b290,0x90);
  if (lags == (int *)0x0) {
    local_49c = 1;
  }
  else {
    local_49c = *lags;
  }
  if (-1 < local_49c) {
    N1 = local_49c + 1;
    iVar5 = N + -1;
    iVar6 = (iVar5 - N1) + 1;
    oup = (double *)malloc((long)iVar5 << 3);
    y_00 = (double *)malloc((long)iVar6 * 8 * (long)N1);
    diff(y,N,1,oup);
    for (iter = 0; iter < N1; iter = iter + 1) {
      for (p = 0; p < iVar6; p = p + 1) {
        y_00[iter * iVar6 + p] = oup[((N1 + p) - iter) + -1];
      }
    }
    pdVar10 = y + local_49c;
    __src = malloc((long)iVar6 << 3);
    res_00 = (double *)malloc((long)iVar6 << 3);
    for (iter = local_49c; iter < iVar5; iter = iter + 1) {
      *(double *)((long)__src + (long)((iter - N1) + 1) * 8) = (double)(iter + 1);
    }
    if (N1 < 2) {
      pdVar9 = (double *)malloc((long)iVar6 << 4);
      iVar7 = strcmp(type,"none");
      if (iVar7 == 0) {
        res = (double *)malloc(8);
        phi1_fit = reg_init(iVar6,1);
        setIntercept(phi1_fit,0);
        memcpy(pdVar9,pdVar10,(long)iVar6 << 3);
        regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
        *teststat = phi1_fit->beta[0].value / phi1_fit->beta[0].stdErr;
        *ltstat = 1;
      }
      else {
        iVar7 = strcmp(type,"drift");
        if (iVar7 == 0) {
          res = (double *)malloc(0x20);
          phi1_fit = reg_init(iVar6,2);
          setIntercept(phi1_fit,1);
          memcpy(pdVar9,pdVar10,(long)iVar6 << 3);
          regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
          dVar1 = *(double *)(phi1_fit + 1);
          dVar2 = phi1_fit[1].sigma_lower;
          dVar3 = phi1_fit->RSS;
          iVar7 = phi1_fit->df_RSS;
          prVar11 = reg_init(iVar6,0);
          regress(prVar11,(double *)0x0,y_00,res_00,res,0.95);
          dVar4 = prVar11->RSS;
          dVar13 = phi1_fit->RSS;
          iVar6 = prVar11->df_RSS;
          iVar8 = phi1_fit->df_RSS;
          *teststat = dVar1 / dVar2;
          teststat[1] = ((dVar4 - dVar13) / (double)(iVar6 - iVar8)) / (dVar3 / (double)iVar7);
          *ltstat = 2;
          free(prVar11);
        }
        else {
          iVar7 = strcmp(type,"trend");
          if (iVar7 == 0) {
            res = (double *)malloc(0x48);
            phi1_fit = reg_init(iVar6,3);
            setIntercept(phi1_fit,1);
            memcpy(pdVar9,pdVar10,(long)iVar6 << 3);
            memcpy(pdVar9 + iVar6,__src,(long)iVar6 << 3);
            regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
            dVar1 = *(double *)(phi1_fit + 1);
            dVar2 = phi1_fit[1].sigma_lower;
            dVar13 = phi1_fit->RSS / (double)phi1_fit->df_RSS;
            prVar11 = reg_init(iVar6,0);
            regress(prVar11,(double *)0x0,y_00,res_00,res,0.95);
            dVar3 = prVar11->RSS;
            dVar4 = phi1_fit->RSS;
            iVar7 = prVar11->df_RSS;
            iVar8 = phi1_fit->df_RSS;
            free(prVar11);
            prVar11 = reg_init(iVar6,1);
            setIntercept(prVar11,1);
            regress(prVar11,(double *)0x0,y_00,res_00,res,0.95);
            cval_tau1[0x11] =
                 ((prVar11->RSS - phi1_fit->RSS) / (double)(prVar11->df_RSS - phi1_fit->df_RSS)) /
                 dVar13;
            *teststat = dVar1 / dVar2;
            teststat[1] = ((dVar3 - dVar4) / (double)(iVar7 - iVar8)) / dVar13;
            teststat[2] = cval_tau1[0x11];
            *ltstat = 3;
            free(prVar11);
          }
        }
      }
      free(pdVar9);
      free(res);
    }
    else {
      iVar7 = strcmp(selectlags,"fixed");
      if (iVar7 != 0) {
        __ptr = malloc((long)N1 << 3);
        pdVar9 = (double *)malloc((long)iVar6 * 8 * (long)(local_49c + 2));
        for (iter = 0; iter < N1; iter = iter + 1) {
          *(undefined8 *)((long)__ptr + (long)iter * 8) = 0x7ff8000000000000;
        }
        for (iter = 1; iter < N1; iter = iter + 1) {
          iVar7 = iter * iVar6;
          memcpy(pdVar9,pdVar10,(long)iVar6 << 3);
          iVar8 = strcmp(type,"none");
          if (iVar8 == 0) {
            iVar8 = iter + 1;
            res = (double *)malloc((long)iVar8 * 8 * (long)iVar8);
            phi1_fit = reg_init(iVar6,iVar8);
            setIntercept(phi1_fit,0);
            memcpy(pdVar9 + iVar6,y_00 + iVar6,(long)iVar7 << 3);
            regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
          }
          else {
            iVar8 = strcmp(type,"drift");
            if (iVar8 == 0) {
              iVar8 = iter + 2;
              res = (double *)malloc((long)iVar8 * 8 * (long)iVar8);
              phi1_fit = reg_init(iVar6,iVar8);
              setIntercept(phi1_fit,1);
              memcpy(pdVar9 + iVar6,y_00 + iVar6,(long)iVar7 << 3);
              regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
            }
            else {
              iVar8 = strcmp(type,"trend");
              if (iVar8 != 0) {
                printf("type only accepts one of three values - none, drift and trend \n");
                exit(-1);
              }
              iVar8 = iter + 3;
              res = (double *)malloc((long)iVar8 * 8 * (long)iVar8);
              phi1_fit = reg_init(iVar6,iVar8);
              setIntercept(phi1_fit,1);
              memcpy(pdVar9 + iVar6,__src,(long)iVar6 << 3);
              memcpy(pdVar9 + iVar6 * 2,y_00 + iVar6,(long)iVar7 << 3);
              regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
            }
          }
          iVar7 = strcmp(selectlags,"aic");
          if (iVar7 == 0) {
            *(double *)((long)__ptr + (long)iter * 8) = phi1_fit->aic;
          }
          else {
            iVar7 = strcmp(selectlags,"bic");
            if (iVar7 == 0) {
              *(double *)((long)__ptr + (long)iter * 8) = phi1_fit->bic;
            }
          }
          free_reg(phi1_fit);
        }
        tau = 1.79769313486232e+308;
        p2 = 0;
        for (iter = 1; iter < N1; iter = iter + 1) {
          if (*(double *)((long)__ptr + (long)iter * 8) < tau) {
            tau = *(double *)((long)__ptr + (long)iter * 8);
            p2 = iter;
          }
        }
        N1 = p2 + 1;
        free(__ptr);
        free(pdVar9);
        free(res);
      }
      pdVar9 = (double *)malloc((long)iVar6 * 8 * (long)(N1 + 1));
      memcpy(pdVar9,pdVar10,(long)iVar6 << 3);
      iVar7 = (N1 + -1) * iVar6;
      iVar8 = strcmp(type,"none");
      if (iVar8 == 0) {
        res = (double *)malloc((long)N1 * 8 * (long)N1);
        phi1_fit = reg_init(iVar6,N1);
        setIntercept(phi1_fit,0);
        memcpy(pdVar9 + iVar6,y_00 + iVar6,(long)iVar7 << 3);
        regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
        *teststat = phi1_fit->beta[0].value / phi1_fit->beta[0].stdErr;
        *ltstat = 1;
      }
      else {
        iVar8 = strcmp(type,"drift");
        if (iVar8 == 0) {
          iVar8 = N1 + 1;
          res = (double *)malloc((long)iVar8 * 8 * (long)iVar8);
          phi1_fit = reg_init(iVar6,iVar8);
          setIntercept(phi1_fit,1);
          memcpy(pdVar9 + iVar6,y_00 + iVar6,(long)iVar7 << 3);
          regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
          dVar1 = *(double *)(phi1_fit + 1);
          dVar2 = phi1_fit[1].sigma_lower;
          dVar3 = phi1_fit->RSS;
          iVar7 = phi1_fit->df_RSS;
          pdVar10 = (double *)malloc((long)iVar6 * 8 * (long)(N1 + -1));
          memcpy(pdVar10,y_00 + iVar6,(long)iVar6 * 8 * (long)(N1 + -1));
          prVar11 = reg_init(iVar6,N1 + -1);
          setIntercept(prVar11,0);
          regress(prVar11,pdVar10,y_00,res_00,res,0.95);
          dVar4 = prVar11->RSS;
          dVar13 = phi1_fit->RSS;
          iVar6 = prVar11->df_RSS;
          iVar8 = phi1_fit->df_RSS;
          *teststat = dVar1 / dVar2;
          teststat[1] = ((dVar4 - dVar13) / (double)(iVar6 - iVar8)) / (dVar3 / (double)iVar7);
          *ltstat = 2;
          free(pdVar10);
          free(prVar11);
        }
        else {
          iVar8 = strcmp(type,"trend");
          if (iVar8 != 0) {
            printf("type only accepts one of three values - none, drift and trend \n");
            exit(-1);
          }
          iVar8 = N1 + 2;
          res = (double *)malloc((long)iVar8 * 8 * (long)iVar8);
          phi1_fit = reg_init(iVar6,iVar8);
          setIntercept(phi1_fit,1);
          memcpy(pdVar9 + iVar6,__src,(long)iVar6 << 3);
          memcpy(pdVar9 + iVar6 * 2,y_00 + iVar6,(long)iVar7 << 3);
          regress(phi1_fit,pdVar9,y_00,res_00,res,0.95);
          dVar1 = *(double *)(phi1_fit + 1);
          dVar2 = phi1_fit[1].sigma_lower;
          dVar13 = phi1_fit->RSS / (double)phi1_fit->df_RSS;
          pdVar10 = (double *)malloc((long)iVar6 * 8 * (long)(N1 + -1));
          memcpy(pdVar10,y_00 + iVar6,(long)iVar6 * 8 * (long)(N1 + -1));
          prVar11 = reg_init(iVar6,N1 + -1);
          setIntercept(prVar11,0);
          regress(prVar11,pdVar10,y_00,res_00,res,0.95);
          dVar3 = prVar11->RSS;
          dVar4 = phi1_fit->RSS;
          iVar7 = prVar11->df_RSS;
          iVar8 = phi1_fit->df_RSS;
          free(pdVar10);
          free(prVar11);
          pdVar10 = (double *)malloc((long)iVar6 * 8 * (long)(N1 + -1));
          memcpy(pdVar10,y_00 + iVar6,(long)iVar6 * 8 * (long)(N1 + -1));
          prVar11 = reg_init(iVar6,N1);
          setIntercept(prVar11,1);
          regress(prVar11,pdVar10,y_00,res_00,res,0.95);
          cval_tau1[0x11] =
               ((prVar11->RSS - phi1_fit->RSS) / (double)(prVar11->df_RSS - phi1_fit->df_RSS)) /
               dVar13;
          *teststat = dVar1 / dVar2;
          teststat[1] = ((dVar3 - dVar4) / (double)(iVar7 - iVar8)) / dVar13;
          teststat[2] = cval_tau1[0x11];
          *ltstat = 3;
          free(pdVar10);
          free(prVar11);
        }
      }
      free(pdVar9);
      free(res);
    }
    if (iVar5 < 0x19) {
      z._4_4_ = 1;
    }
    else if (iVar5 < 0x32) {
      z._4_4_ = 2;
    }
    else if (iVar5 < 100) {
      z._4_4_ = 3;
    }
    else if (iVar5 < 0xfa) {
      z._4_4_ = 4;
    }
    else if (iVar5 < 500) {
      z._4_4_ = 5;
    }
    else {
      z._4_4_ = 6;
    }
    iVar5 = z._4_4_ + -1;
    iVar6 = strcmp(type,"none");
    if (iVar6 == 0) {
      lVar12 = (long)(iVar5 * 3);
      *cval = cval_tau2[lVar12 + 0x11];
      cval[1] = cval_tau1[lVar12];
      cval[2] = cval_tau1[lVar12 + 1];
      *cvrows = 1;
      *cvcols = 3;
    }
    else {
      iVar6 = strcmp(type,"drift");
      if (iVar6 == 0) {
        lVar12 = (long)(iVar5 * 3);
        *cval = cval_tau3[lVar12 + 0x11];
        cval[1] = cval_tau2[lVar12];
        cval[2] = cval_tau2[lVar12 + 1];
        lVar12 = (long)(iVar5 * 3);
        cval[3] = cval_phi2[lVar12 + 0x11];
        cval[4] = cval_phi1[lVar12];
        cval[5] = cval_phi1[lVar12 + 1];
        *cvrows = 2;
        *cvcols = 3;
      }
      else {
        iVar6 = strcmp(type,"trend");
        if (iVar6 == 0) {
          lVar12 = (long)(iVar5 * 3);
          *cval = cval_phi1[lVar12 + 0x11];
          cval[1] = cval_tau3[lVar12];
          cval[2] = cval_tau3[lVar12 + 1];
          lVar12 = (long)(iVar5 * 3);
          cval[3] = cval_phi3[lVar12 + 0x11];
          cval[4] = cval_phi2[lVar12];
          cval[5] = cval_phi2[lVar12 + 1];
          lVar12 = (long)(iVar5 * 3);
          cval[6] = cval_phi3[lVar12 + -1];
          cval[7] = cval_phi3[lVar12];
          cval[8] = cval_phi3[lVar12 + 1];
          *cvrows = 3;
          *cvcols = 3;
        }
      }
    }
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    free(y_00);
    free(oup);
    free(__src);
    free(res_00);
    free(phi1_fit);
    return;
  }
  printf("lags should be > 0. \n");
  exit(-1);
}

Assistant:

void ur_df2(double *y, int N,const char* type, int *lags,const char *selectlags,double *cval,int *cvrows, int *cvcols, double *cprobs, double *teststat,int *ltstat) {
    int lags_, lag, N1, N2,i,j,iter,p,ltmp,p1,p2,p3,rowselec,row1;
    double *z, *x,*z_diff,*z_lag_1,*tt,*critRes,*z_diff_lag,*XX,*varcovar,*res,*XX2,*XX3;
    reg_object fit, phi1_fit,phi2_fit,phi3_fit;
    double alpha = 0.95;
    double ctemp,tau,scale,sos,dfs,phi1,phi2,phi3;
    double cval_tau1[18] = {-2.66, -1.95, -1.60,-2.62, -1.95, -1.61,-2.60, -1.95, -1.61,-2.58, -1.95, -1.62,
        -2.58, -1.95, -1.62,-2.58, -1.95, -1.62};
    double cval_tau2[18] = {-3.75, -3.00, -2.63,-3.58, -2.93, -2.60,-3.51, -2.89, -2.58,-3.46, -2.88, -2.57,
        -3.44, -2.87, -2.57,-3.43, -2.86, -2.57};
    double cval_tau3[18] = {-4.38, -3.60, -3.24,-4.15, -3.50, -3.18,-4.04, -3.45, -3.15,-3.99, -3.43, -3.13,
        -3.98, -3.42, -3.13,-3.96, -3.41, -3.12};
    double cval_phi1[18] = {7.88, 5.18, 4.12,7.06, 4.86, 3.94,6.70, 4.71, 3.86,6.52, 4.63, 3.81,6.47, 4.61,
         3.79,6.43, 4.59, 3.78};
    double cval_phi2[18] = {8.21, 5.68, 4.67,7.02, 5.13, 4.31,6.50, 4.88, 4.16,6.22, 4.75, 4.07,6.15, 4.71,
         4.05,6.09, 4.68, 4.03};
    double cval_phi3[18] = {10.61, 7.24, 5.91,9.31, 6.73, 5.61,8.73, 6.49, 5.47,8.43, 6.49, 5.47,8.34, 6.30,
         5.36,8.27, 6.25, 5.34};

    lags_ = (lags == NULL) ? 1 : *lags;
    lag = lags_;

    if (lag < 0) {
        printf("lags should be > 0. \n");
        exit(-1);
    }

    lags_+=1;

    N1 = N - 1;
    N2 = N1 - lags_ + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*N2*lags_);
    

    diff(y,N,1,z);// z = y(t) - y(t-1)
    
    for(i = 0; i < lags_;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags_+j-i-1];
        }
    } 


    z_diff = &x[0];//length N2
    z_lag_1 = &y[lags_-1];//length N2


    tt = (double*)malloc(sizeof(double)*N2);
    res = (double*)malloc(sizeof(double)*N2);

    for(i = lags_ - 1; i < N1;++i) {
        tt[i - lags_ +1] = i+1;
    }

    if (lags_ > 1) {
        if (strcmp(selectlags,"fixed")) {
            critRes = (double*) malloc(sizeof(double)*lags_);
            XX = (double*)malloc(sizeof(double)*N2*(lags_+1));
            for(i = 0; i < lags_;++i) {
                critRes[i] = NAN;
            }

            for(i = 1; i < lags_;++i) {
                iter = i * N2;

                memcpy(XX,z_lag_1,sizeof(double)*N2);

                if (!strcmp(type,"none")) {
                    p = 1 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,0);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);
                    
                } else if (!strcmp(type,"drift")) {
                    p = 2 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else if (!strcmp(type,"trend")) {
                    p = 3 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,tt,sizeof(double)*N2);
                    memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else {
                    printf("type only accepts one of three values - none, drift and trend \n");
                    exit(-1);
                }

                if (!strcmp(selectlags,"aic")) {
                    critRes[i] = fit->aic;
                } else if (!strcmp(selectlags,"bic")) {
                    critRes[i] = fit->bic;
                }

                free_reg(fit);
            }

            ctemp = DBL_MAX;
            ltmp = 0;

            for(i = 1; i < lags_;++i) {
                if (critRes[i] < ctemp) {
                    ctemp = critRes[i];
                    ltmp = i;
                }
            }

            lags_ = ltmp+1;


            free(critRes);
            free(XX);
            free(varcovar);
        }

        XX = (double*)malloc(sizeof(double)*N2*(lags_+1));

        memcpy(XX,z_lag_1,sizeof(double)*N2);
        iter = (lags_-1) * N2;

        if (!strcmp(type,"none")) {
            p = lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 1 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p1 = lags_ - 1;
            phi1_fit = reg_init(N2,p1);
            setIntercept(phi1_fit,0);
            regress(phi1_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;


            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(XX2);
            free(phi1_fit);
        } else if (!strcmp(type,"trend")) {
            p = 2 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p2 = lags_ - 1;
            phi2_fit = reg_init(N2,p2);
            setIntercept(phi2_fit,0);
            regress(phi2_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;


            free(XX2);
            free(phi2_fit);

            XX3 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX3,x+N2,sizeof(double)*N2*(lags_-1));
            p3 = lags_;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,XX3,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(XX3);
            free(phi3_fit);
        } else {
            printf("type only accepts one of three values - none, drift and trend \n");
            exit(-1);
        }

        free(XX);
        free(varcovar);

    } else {
        XX = (double*)malloc(sizeof(double)*2*N2);
        if (!strcmp(type,"none")) {
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p1 = 0;
            phi1_fit = reg_init(N2,p1);
            regress(phi1_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(phi1_fit);

        } else if (!strcmp(type,"trend")) {
            p = 3;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p2 = 0;
            phi2_fit = reg_init(N2,p2);
            regress(phi2_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;

            free(phi2_fit);

            p3 = 1;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(phi3_fit);
        }

        free(XX);
        free(varcovar);
    }

    
    if (N1 < 25){
        rowselec = 1;
    } else if (N1 < 50) {
        rowselec = 2;
    } else if (N1 < 100) {
        rowselec = 3;
    } else if (N1 < 250) {
        rowselec = 4;
    } else if (N1 < 500) {
        rowselec = 5;
    } else {
        rowselec = 6;
    }
    row1 = rowselec - 1;

    if (!strcmp(type,"none")) {
        memcpy(cval,cval_tau1+row1*3,sizeof(double)*3);
        *cvrows = 1;
        *cvcols = 3;
    } else if (!strcmp(type,"drift")) {
        memcpy(cval,cval_tau2+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi1+row1*3,sizeof(double)*3);
        *cvrows = 2;
        *cvcols = 3;
    } else if (!strcmp(type,"trend")) {
        memcpy(cval,cval_tau3+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi2+row1*3,sizeof(double)*3);
        memcpy(cval+6,cval_phi3+row1*3,sizeof(double)*3);
        *cvrows = 3;
        *cvcols = 3;
    }


    cprobs[0] = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;

    free(x);
    free(z);
    free(tt);
    free(res);
    free(fit);
}